

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_VerilogSimpleLex(char *pFileName,Abc_Nam_t *pNames)

{
  int Entry;
  int iVar1;
  char *__s;
  size_t sVar2;
  bool bVar3;
  int iToken;
  char *pLimit;
  char *pStart;
  char *pToken;
  char *pBuffer;
  Vec_Int_t *vBuffer;
  Abc_Nam_t *pNames_local;
  char *pFileName_local;
  
  pFileName_local = (char *)Vec_IntAlloc(1000);
  __s = Extra_FileReadContents(pFileName);
  sVar2 = strlen(__s);
  if (__s == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Acb_VerilogRemoveComments(__s);
    pStart = strtok(__s,"  \n\r\t(),;=");
    while (pStart != (char *)0x0) {
      Entry = Abc_NamStrFindOrAdd(pNames,pStart,(int *)0x0);
      iVar1 = strcmp(pStart,"assign");
      if (iVar1 == 0) {
        Vec_IntPush((Vec_Int_t *)pFileName_local,6);
      }
      else {
        Vec_IntPush((Vec_Int_t *)pFileName_local,Entry);
      }
      if ((Entry < 6) || (0xd < Entry)) {
LAB_00431efc:
        pStart = strtok((char *)0x0,"  \n\r\t(),;=");
      }
      else {
        pLimit = pStart;
        while( true ) {
          bVar3 = false;
          if (pLimit < __s + sVar2) {
            bVar3 = *pLimit != '\n';
          }
          if ((!bVar3) || (*pLimit == '(')) break;
          pLimit = pLimit + 1;
        }
        if (*pLimit != '(') goto LAB_00431efc;
        pStart = strtok(pLimit,"  \n\r\t(),;=");
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Acb_VerilogSimpleLex( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vBuffer = Vec_IntAlloc( 1000 );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pStart, * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    Acb_VerilogRemoveComments( pBuffer );
    pToken = strtok( pBuffer, "  \n\r\t(),;=" );
    while ( pToken )
    {
        int iToken = Abc_NamStrFindOrAdd( pNames, pToken, NULL );
        if ( !strcmp(pToken, "assign") )
            Vec_IntPush( vBuffer, ACB_BUF );
        else
            Vec_IntPush( vBuffer, iToken );
        if ( iToken >= ACB_BUF && iToken < ACB_UNUSED )
        {
            for ( pStart = pToken; pStart < pLimit && *pStart != '\n'; pStart++ )
                if ( *pStart == '(' )
                    break;
            if ( *pStart == '(' )
            {
                pToken = strtok( pStart, "  \n\r\t(),;=" );
                continue;
            }
        }
        pToken = strtok( NULL, "  \n\r\t(),;=" );
    }
    ABC_FREE( pBuffer );
    return vBuffer;
}